

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

Span<char> __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::GetAppendBufferSlow(CordRepBtree *this,size_t size)

{
  byte bVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  pointer pcVar5;
  sbyte sVar6;
  int iVar7;
  sbyte sVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  CordRepBtree *pCVar12;
  bool bVar13;
  bool bVar14;
  Span<char> SVar15;
  CordRepBtree *stack [12];
  long alStack_70 [13];
  
  if ((this->super_CordRep).storage[0] < 4) {
    alStack_70[0] = 0x2c1592;
    __assert_fail("height() >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3f7,"Span<char> absl::cord_internal::CordRepBtree::GetAppendBufferSlow(size_t)"
                 );
  }
  if ((this->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
    alStack_70[0] = 0x2c15b1;
    __assert_fail("refcount.IsOne()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3f8,"Span<char> absl::cord_internal::CordRepBtree::GetAppendBufferSlow(size_t)"
                 );
  }
  uVar11 = (ulong)(this->super_CordRep).storage[0];
  bVar13 = uVar11 != 0;
  pCVar12 = this;
  if (bVar13) {
    uVar10 = 1;
    do {
      pCVar12 = *(CordRepBtree **)
                 ((pCVar12->super_CordRep).storage +
                 (ulong)(pCVar12->super_CordRep).storage[2] * 8 + -5);
      if ((pCVar12->super_CordRep).tag != '\x03') {
        alStack_70[0] = 0x2c1554;
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
      if ((pCVar12->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) break;
      alStack_70[uVar10] = (long)pCVar12;
      bVar13 = uVar10 < uVar11;
      bVar14 = uVar10 != uVar11;
      uVar10 = uVar10 + 1;
    } while (bVar14);
  }
  sVar9 = 0;
  pcVar5 = (pointer)0x0;
  if (!bVar13) {
    plVar2 = *(long **)((pCVar12->super_CordRep).storage +
                       (ulong)(pCVar12->super_CordRep).storage[2] * 8 + -5);
    sVar9 = 0;
    pcVar5 = (pointer)0x0;
    if ((int)plVar2[1] == 2) {
      bVar1 = *(byte *)((long)plVar2 + 0xc);
      sVar9 = 0;
      pcVar5 = (pointer)0x0;
      if (5 < bVar1) {
        if ((bVar1 - 0xf9 < 7) || (bVar1 < 6)) {
LAB_002c1554:
          alStack_70[0] = 0x2c1573;
          __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                        ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
        }
        iVar7 = -0xb8000;
        if (bVar1 < 0xbb) {
          iVar7 = -0xe80;
        }
        sVar8 = 0xc;
        if (bVar1 < 0xbb) {
          sVar8 = 6;
        }
        iVar4 = -0x10;
        if (0x42 < bVar1) {
          iVar4 = iVar7;
        }
        sVar6 = 3;
        if (0x42 < bVar1) {
          sVar6 = sVar8;
        }
        lVar3 = *plVar2;
        sVar9 = (size_t)(uint)(0 << sVar6);
        pcVar5 = (pointer)0x0;
        uVar10 = (int)(iVar4 + ((uint)bVar1 << sVar6) + -0xd) - lVar3;
        if (uVar10 != 0) {
          sVar9 = size;
          if (uVar10 < size) {
            sVar9 = uVar10;
          }
          if ((bVar1 - 0xf9 < 7) || (bVar1 < 6)) goto LAB_002c1554;
          pcVar5 = (pointer)((long)plVar2 + lVar3 + 0xd);
          *plVar2 = lVar3 + sVar9;
          (this->super_CordRep).length = (this->super_CordRep).length + sVar9;
          if (uVar11 != 0) {
            uVar10 = 0;
            do {
              *(long *)alStack_70[uVar10 + 1] = *(long *)alStack_70[uVar10 + 1] + sVar9;
              uVar10 = uVar10 + 1;
            } while (uVar11 != uVar10);
          }
        }
      }
    }
  }
  SVar15.len_ = sVar9;
  SVar15.ptr_ = pcVar5;
  return SVar15;
}

Assistant:

Span<char> CordRepBtree::GetAppendBufferSlow(size_t size) {
  // The inlined version in `GetAppendBuffer()` deals with all heights <= 3.
  assert(height() >= 4);
  assert(refcount.IsOne());

  // Build a stack of nodes we may potentially need to update if we find a
  // non-shared FLAT with capacity at the leaf level.
  const int depth = height();
  CordRepBtree* node = this;
  CordRepBtree* stack[kMaxDepth];
  for (int i = 0; i < depth; ++i) {
    node = node->Edge(kBack)->btree();
    if (!node->refcount.IsOne()) return {};
    stack[i] = node;
  }

  // Must be a privately owned, mutable flat.
  CordRep* const edge = node->Edge(kBack);
  if (!edge->refcount.IsOne() || edge->tag < FLAT) return {};

  // Must have capacity.
  const size_t avail = edge->flat()->Capacity() - edge->length;
  if (avail == 0) return {};

  // Build span on remaining capacity.
  size_t delta = (std::min)(size, avail);
  Span<char> span = {edge->flat()->Data() + edge->length, delta};
  edge->length += delta;
  this->length += delta;
  for (int i = 0; i < depth; ++i) {
    stack[i]->length += delta;
  }
  return span;
}